

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void poolDestroy(STRING_POOL *pool)

{
  block *pbVar1;
  BLOCK *tem_1;
  BLOCK *tem;
  BLOCK *p;
  STRING_POOL *pool_local;
  
  tem = pool->blocks;
  while (tem != (BLOCK *)0x0) {
    pbVar1 = tem->next;
    (*pool->mem->free_fcn)(tem);
    tem = pbVar1;
  }
  tem = pool->freeBlocks;
  while (tem != (BLOCK *)0x0) {
    pbVar1 = tem->next;
    (*pool->mem->free_fcn)(tem);
    tem = pbVar1;
  }
  return;
}

Assistant:

static void FASTCALL
poolDestroy(STRING_POOL *pool) {
  BLOCK *p = pool->blocks;
  while (p) {
    BLOCK *tem = p->next;
    pool->mem->free_fcn(p);
    p = tem;
  }
  p = pool->freeBlocks;
  while (p) {
    BLOCK *tem = p->next;
    pool->mem->free_fcn(p);
    p = tem;
  }
}